

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O0

char * readline(char *source,int *pointer)

{
  char *pcVar1;
  bool bVar2;
  int local_24;
  void *pvStack_20;
  int i;
  char *line;
  int *pointer_local;
  char *source_local;
  
  pvStack_20 = (void *)0x0;
  local_24 = 0;
  while( true ) {
    bVar2 = true;
    if (source[*pointer] != '\r') {
      bVar2 = source[*pointer] == '\n';
    }
    if (bVar2) break;
    pvStack_20 = realloc(pvStack_20,(long)(local_24 + 1));
    *(char *)((long)pvStack_20 + (long)local_24) = source[*pointer];
    *pointer = *pointer + 1;
    local_24 = local_24 + 1;
  }
  if (source[*pointer] == '\r') {
    *pointer = *pointer + 1;
  }
  *pointer = *pointer + 1;
  pcVar1 = (char *)realloc(pvStack_20,(long)(local_24 + 2));
  pcVar1[local_24 + 1] = '\0';
  pcVar1[local_24] = '\n';
  return pcVar1;
}

Assistant:

static char* readline(const char *source, int *pointer){
    char *line = NULL;
    int i = 0;
    while(!(source[*pointer] == '\r' || source[*pointer] == '\n')){
        i++;
        line = (char *)reallocate(line, sizeof(char) * i);
        line[i - 1] = source[*pointer];
        *pointer = *pointer + 1;
    }
    if(source[*pointer] == '\r')
        *pointer = *pointer + 1;
    *pointer = *pointer + 1;
    
    i += 2;
    line = (char *)reallocate(line, sizeof(char) * i);
    line[i - 1] = '\0';
    line[i - 2] = '\n';

    return line;
}